

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::visit(FunctionResolver *this,CallOrCast *call)

{
  Allocator *pAVar1;
  CallOrCastBase *pCVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  Expression *pEVar6;
  QualifiedIdentifier *pQVar7;
  PossibleFunction *pPVar8;
  CallOrCast *pCVar9;
  size_t sVar10;
  pool_ref *ppVar11;
  size_t sVar12;
  Type *pTVar13;
  CommaSeparatedList *pCVar14;
  pool_ref<soul::AST::Expression> *ppVar15;
  Expression *source;
  PossibleFunction *extraout_RDX;
  PossibleFunction *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  pool_ref<soul::AST::Expression> *in_R8;
  ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction> matches;
  ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction> matches_00;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args_01;
  IdentifierPath local_5e8;
  string local_590;
  string local_570;
  CompileMessage local_550;
  ArrayView<soul::pool_ref<soul::AST::Function>_> local_518;
  pool_ref<soul::AST::Function> local_508;
  PossibleFunction *local_500;
  PossibleFunction *f_3;
  PossibleFunction *__end6;
  PossibleFunction *__begin6;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *__range6;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> functions;
  string local_450;
  string local_430;
  CompileMessage local_410;
  Type local_3d8;
  ulong local_3c0;
  size_t i;
  TypeArray paramTypes;
  PossibleFunction *local_2d8;
  size_t possibleWithCast;
  undefined1 local_2c0 [8];
  pool_ptr<soul::AST::Expression> e;
  PossibleFunction *f_2;
  PossibleFunction *__end4_1;
  PossibleFunction *__begin4_1;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *__range4_1;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> matchingGenerics;
  pool_ptr<soul::AST::Expression> resolved_1;
  PossibleFunction *f_1;
  PossibleFunction *__end5_1;
  PossibleFunction *__begin5_1;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *__range5_1;
  PossibleFunction *local_230;
  size_t local_228;
  size_t exactMatches;
  pool_ptr<soul::AST::Expression> resolved;
  size_t totalMatches;
  PossibleFunction *f;
  PossibleFunction *__end4;
  PossibleFunction *__begin4;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> *__range4;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> possibles;
  pool_ref<soul::AST::Expression> *arg;
  pool_ref<soul::AST::Expression> *__end5;
  pool_ref<soul::AST::Expression> *__begin5;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range5;
  Allocator *local_120;
  pool_ref<soul::AST::Expression> *local_118;
  IdentifierPath local_110;
  uint local_b4;
  IdentifierPath local_b0;
  pool_ref<soul::AST::Expression> local_58;
  pool_ptr<soul::AST::QualifiedIdentifier> local_50;
  pool_ptr<soul::AST::QualifiedIdentifier> name;
  Type local_38;
  CallOrCast *local_20;
  CallOrCast *call_local;
  FunctionResolver *this_local;
  
  local_20 = call;
  call_local = (CallOrCast *)this;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,call);
  pEVar6 = pool_ref<soul::AST::Expression>::get(&local_20->nameOrType);
  bVar4 = AST::isResolvedAsType(pEVar6);
  pCVar9 = local_20;
  if (bVar4) {
    pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    pEVar6 = pool_ref<soul::AST::Expression>::operator->(&local_20->nameOrType);
    (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[5])();
    this_local = (FunctionResolver *)convertToCast(pAVar1,pCVar9,&local_38);
    Type::~Type(&local_38);
    return (Expression *)this_local;
  }
  bVar4 = AST::CallOrCastBase::areAllArgumentsResolved(&local_20->super_CallOrCastBase);
  if (!bVar4) goto LAB_0044c997;
  local_58.object = (local_20->nameOrType).object;
  cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&local_50,&local_58);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_58);
  bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
  if (bVar4) {
    pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
    AST::QualifiedIdentifier::getPath(&local_b0,pQVar7);
    bVar4 = IdentifierPath::isUnqualifiedName(&local_b0,"advance");
    IdentifierPath::~IdentifierPath(&local_b0);
    if (bVar4) {
      this_local = (FunctionResolver *)createAdvanceCall(this,local_20);
      local_b4 = 1;
    }
    else {
      pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
      AST::QualifiedIdentifier::getPath(&local_110,pQVar7);
      bVar4 = IdentifierPath::isUnqualifiedName(&local_110,"static_assert");
      IdentifierPath::~IdentifierPath(&local_110);
      if (bVar4) {
        pCVar2 = &local_20->super_CallOrCastBase;
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        pCVar14 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                            (&(local_20->super_CallOrCastBase).arguments);
        ArrayView<soul::pool_ref<soul::AST::Expression>>::
        ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>>
                  ((ArrayView<soul::pool_ref<soul::AST::Expression>> *)&local_120,&pCVar14->items);
        args_01.e = in_R8;
        args_01.s = local_118;
        this_local = (FunctionResolver *)
                     ASTUtilities::createStaticAssertion
                               ((ASTUtilities *)
                                &(pCVar2->super_Expression).super_Statement.super_ASTObject.context,
                                (Context *)pAVar1,local_120,args_01);
        local_b4 = 1;
      }
      else {
        pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
        AST::QualifiedIdentifier::getPath((IdentifierPath *)&__range5,pQVar7);
        bVar4 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&__range5,"at");
        IdentifierPath::~IdentifierPath((IdentifierPath *)&__range5);
        if (bVar4) {
          this_local = (FunctionResolver *)createAtCall(this,local_20);
          local_b4 = 1;
        }
        else {
          pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
          bVar4 = AST::QualifiedIdentifier::isSimplePath(pQVar7);
          if (bVar4) {
            bVar4 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                              (&(local_20->super_CallOrCastBase).arguments,(void *)0x0);
            if (bVar4) {
              pCVar14 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                  (&(local_20->super_CallOrCastBase).arguments);
              __end5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin
                                 (&pCVar14->items);
              ppVar15 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end
                                  (&pCVar14->items);
              for (; __end5 != ppVar15; __end5 = __end5 + 1) {
                possibles.space[7] = (uint64_t)__end5;
                pEVar6 = pool_ref<soul::AST::Expression>::get(__end5);
                bVar4 = AST::isResolvedAsValue(pEVar6);
                if (!bVar4) {
                  if (((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1U) != 0) {
                    (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
                         (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
                    this_local = (FunctionResolver *)local_20;
                    local_b4 = 1;
                    goto LAB_0044c973;
                  }
                  pEVar6 = pool_ref::operator_cast_to_Expression_((pool_ref *)possibles.space[7]);
                  SanityCheckPass::throwErrorIfNotReadableValue(pEVar6);
                }
              }
            }
            pCVar9 = local_20;
            pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*(&local_50);
            findAllPossibleFunctions
                      ((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                        *)&__range4,this,pCVar9,pQVar7);
            __end4 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                     ::begin((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                              *)&__range4);
            pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                     ::end((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                            *)&__range4);
            for (; __end4 != pPVar8; __end4 = __end4 + 1) {
              if ((__end4->functionIsNotResolved & 1U) != 0) {
                this_local = (FunctionResolver *)local_20;
                local_b4 = 1;
                goto LAB_0044c935;
              }
            }
            resolved.object =
                 (Expression *)
                 ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                 ::size((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                         *)&__range4);
            if ((resolved.object == (Expression *)0x1) &&
               (pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                         ::front((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                  *)&__range4), (pPVar8->isImpossible & 1U) == 0)) {
              pCVar9 = (CallOrCast *)
                       ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                       ::front((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                *)&__range4);
              resolveFunction((FunctionResolver *)&exactMatches,(PossibleFunction *)this,pCVar9,
                              SUB81(local_20,0));
              bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&exactMatches);
              if (bVar4) {
                this_local = (FunctionResolver *)
                             pool_ptr<soul::AST::Expression>::operator*
                                       ((pool_ptr<soul::AST::Expression> *)&exactMatches);
              }
              local_b4 = (uint)bVar4;
              pool_ptr<soul::AST::Expression>::~pool_ptr
                        ((pool_ptr<soul::AST::Expression> *)&exactMatches);
              if (local_b4 == 0) {
                this_local = (FunctionResolver *)local_20;
                local_b4 = 1;
              }
            }
            else {
              ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction>::
              ArrayView<soul::ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,4ul>>
                        ((ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction> *)
                         &__range5_1,
                         (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                          *)&__range4);
              matches.e = extraout_RDX;
              matches.s = local_230;
              local_228 = countNumberOfExactMatches((FunctionResolver *)__range5_1,matches);
              if (local_228 == 1) {
                __end5_1 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                           ::begin((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                    *)&__range4);
                pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                         ::end((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                *)&__range4);
                while( true ) {
                  if (__end5_1 == pPVar8) {
                    throwInternalCompilerError("visit",0x900);
                  }
                  bVar4 = PossibleFunction::isExactMatch(__end5_1);
                  if (bVar4) break;
                  __end5_1 = __end5_1 + 1;
                }
                resolveFunction((FunctionResolver *)(matchingGenerics.space + 3),
                                (PossibleFunction *)this,(CallOrCast *)__end5_1,SUB81(local_20,0));
                bVar4 = soul::pool_ptr::operator_cast_to_bool
                                  ((pool_ptr *)(matchingGenerics.space + 3));
                if (bVar4) {
                  this_local = (FunctionResolver *)
                               pool_ptr<soul::AST::Expression>::operator*
                                         ((pool_ptr<soul::AST::Expression> *)
                                          (matchingGenerics.space + 3));
                }
                local_b4 = (uint)bVar4;
                pool_ptr<soul::AST::Expression>::~pool_ptr
                          ((pool_ptr<soul::AST::Expression> *)(matchingGenerics.space + 3));
                if (local_b4 == 0) {
                  this_local = (FunctionResolver *)local_20;
                  local_b4 = 1;
                }
              }
              else {
                ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                ArrayWithPreallocation
                          ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                           &__range4_1);
                __end4_1 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                           ::begin((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                    *)&__range4);
                pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                         ::end((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                *)&__range4);
                for (; __end4_1 != pPVar8; __end4_1 = __end4_1 + 1) {
                  e.object = (Expression *)__end4_1;
                  if (((__end4_1->isImpossible & 1U) == 0) &&
                     ((__end4_1->requiresGeneric & 1U) != 0)) {
                    resolveFunction((FunctionResolver *)local_2c0,(PossibleFunction *)this,
                                    (CallOrCast *)__end4_1,SUB81(local_20,0));
                    bVar4 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_2c0);
                    if (bVar4) {
                      pEVar6 = pool_ptr<soul::AST::Expression>::operator*
                                         ((pool_ptr<soul::AST::Expression> *)local_2c0);
                      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>
                                ((pool_ref<soul::AST::Expression> *)&possibleWithCast,pEVar6);
                      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                  *)&__range4_1,(pool_ref<soul::AST::Expression> *)&possibleWithCast
                                );
                      pool_ref<soul::AST::Expression>::~pool_ref
                                ((pool_ref<soul::AST::Expression> *)&possibleWithCast);
LAB_0044c19c:
                      local_b4 = 0;
                    }
                    else {
                      uVar5 = (*(this->super_ErrorIgnoringRewritingASTVisitor).
                                super_RewritingASTVisitor._vptr_RewritingASTVisitor[0x38])();
                      if ((uVar5 & 1) != 0) goto LAB_0044c19c;
                      this_local = (FunctionResolver *)local_20;
                      local_b4 = 1;
                    }
                    pool_ptr<soul::AST::Expression>::~pool_ptr
                              ((pool_ptr<soul::AST::Expression> *)local_2c0);
                    if (local_b4 != 0) goto LAB_0044c929;
                  }
                }
                sVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                                   ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                     *)&__range4_1);
                if (sVar10 == 1) {
                  ppVar11 = (pool_ref *)
                            ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                            front((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                   *)&__range4_1);
                  this_local = (FunctionResolver *)pool_ref::operator_cast_to_Expression_(ppVar11);
                  local_b4 = 1;
                }
                else {
                  if ((((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors & 1U) == 0) ||
                     (sVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                               size((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                     *)&__range4_1), 1 < sVar10)) {
                    pCVar9 = local_20;
                    if (resolved.object == (Expression *)0x0) {
                      pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*(&local_50);
                      throwErrorForUnknownFunction(this,pCVar9,pQVar7);
                    }
                    ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction>::
                    ArrayView<soul::ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,4ul>>
                              ((ArrayView<soul::ResolutionPass::FunctionResolver::PossibleFunction>
                                *)(paramTypes.space + 0x17),
                               (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                *)&__range4);
                    matches_00.e = extraout_RDX_00;
                    matches_00.s = local_2d8;
                    sVar10 = countNumberOfMatchesWithCast
                                       ((FunctionResolver *)paramTypes.space[0x17],matches_00);
                    if (local_228 + sVar10 == 0) {
                      if ((resolved.object == (Expression *)0x1) &&
                         (pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                   ::front((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                            *)&__range4), (pPVar8->requiresGeneric & 1U) == 0)) {
                        pPVar8 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                 ::front((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                          *)&__range4);
                        AST::Function::getParameterTypes((TypeArray *)&i,pPVar8->function);
                        sVar10 = ArrayWithPreallocation<soul::Type,_8UL>::size
                                           ((ArrayWithPreallocation<soul::Type,_8UL> *)&i);
                        sVar12 = AST::CallOrCastBase::getNumArguments
                                           (&local_20->super_CallOrCastBase);
                        checkAssertion(sVar10 == sVar12,
                                       "paramTypes.size() == call.getNumArguments()","visit",0x920);
                        for (local_3c0 = 0; uVar3 = local_3c0,
                            sVar10 = ArrayWithPreallocation<soul::Type,_8UL>::size
                                               ((ArrayWithPreallocation<soul::Type,_8UL> *)&i),
                            uVar3 < sVar10; local_3c0 = local_3c0 + 1) {
                          pTVar13 = ArrayWithPreallocation<soul::Type,_8UL>::operator[]
                                              ((ArrayWithPreallocation<soul::Type,_8UL> *)&i,
                                               local_3c0);
                          pCVar14 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                              (&(local_20->super_CallOrCastBase).arguments);
                          ppVar15 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                    ::operator[](&pCVar14->items,local_3c0);
                          pEVar6 = pool_ref<soul::AST::Expression>::operator->(ppVar15);
                          (*(pEVar6->super_Statement).super_ASTObject._vptr_ASTObject[4])
                                    (&local_3d8);
                          bVar4 = TypeRules::canPassAsArgumentTo(pTVar13,&local_3d8,true);
                          Type::~Type(&local_3d8);
                          if (((bVar4 ^ 0xffU) & 1) != 0) {
                            pCVar14 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                                (&(local_20->super_CallOrCastBase).arguments);
                            ppVar15 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                      ::operator[](&pCVar14->items,local_3c0);
                            pEVar6 = pool_ref<soul::AST::Expression>::operator->(ppVar15);
                            pTVar13 = ArrayWithPreallocation<soul::Type,_8UL>::operator[]
                                                ((ArrayWithPreallocation<soul::Type,_8UL> *)&i,
                                                 local_3c0);
                            pCVar14 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                                                (&(local_20->super_CallOrCastBase).arguments);
                            ppVar11 = (pool_ref *)
                                      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                      ::operator[](&pCVar14->items,local_3c0);
                            source = pool_ref::operator_cast_to_Expression_(ppVar11);
                            SanityCheckPass::expectSilentCastPossible
                                      (&(pEVar6->super_Statement).super_ASTObject.context,pTVar13,
                                       source);
                          }
                        }
                        ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation
                                  ((ArrayWithPreallocation<soul::Type,_8UL> *)&i);
                      }
                      if ((resolved.object == (Expression *)0x0) ||
                         (sVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                   ::size((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                           *)&__range4_1), sVar10 < 2)) {
                        pCVar9 = local_20;
                        pCVar2 = &local_20->super_CallOrCastBase;
                        pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
                        AST::QualifiedIdentifier::getPath
                                  ((IdentifierPath *)(functions.space + 3),pQVar7);
                        IdentifierPath::toString_abi_cxx11_
                                  (&local_450,(IdentifierPath *)(functions.space + 3));
                        AST::CallOrCastBase::getDescription
                                  (&local_430,&pCVar9->super_CallOrCastBase,&local_450);
                        Errors::noMatchForFunctionCall<std::__cxx11::string>
                                  (&local_410,(Errors *)&local_430,args);
                        AST::Context::throwError
                                  (&(pCVar2->super_Expression).super_Statement.super_ASTObject.
                                    context,&local_410,false);
                      }
                    }
                    if (((Expression *)0x1 < resolved.object) ||
                       (sVar10 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                 ::size((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
                                         *)&__range4_1), 1 < sVar10)) {
                      ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::
                      ArrayWithPreallocation
                                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> *
                                 )&__range6);
                      __begin6 = (PossibleFunction *)&__range4;
                      __end6 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                               ::begin((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                        *)__begin6);
                      f_3 = ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                            ::end((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                                   *)__begin6);
                      for (; __end6 != f_3; __end6 = __end6 + 1) {
                        local_500 = __end6;
                        pool_ref<soul::AST::Function>::pool_ref<soul::AST::Function,void>
                                  (&local_508,__end6->function);
                        ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::push_back
                                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>
                                    *)&__range6,&local_508);
                        pool_ref<soul::AST::Function>::~pool_ref(&local_508);
                      }
                      ArrayView<soul::pool_ref<soul::AST::Function>>::
                      ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,4ul>>
                                ((ArrayView<soul::pool_ref<soul::AST::Function>> *)&local_518,
                                 (ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> *
                                 )&__range6);
                      SanityCheckPass::checkForDuplicateFunctions(local_518);
                      pCVar9 = local_20;
                      pCVar2 = &local_20->super_CallOrCastBase;
                      pQVar7 = pool_ptr<soul::AST::QualifiedIdentifier>::operator->(&local_50);
                      AST::QualifiedIdentifier::getPath(&local_5e8,pQVar7);
                      IdentifierPath::toString_abi_cxx11_(&local_590,&local_5e8);
                      AST::CallOrCastBase::getDescription
                                (&local_570,&pCVar9->super_CallOrCastBase,&local_590);
                      Errors::ambiguousFunctionCall<std::__cxx11::string>
                                (&local_550,(Errors *)&local_570,args_00);
                      AST::Context::throwError
                                (&(pCVar2->super_Expression).super_Statement.super_ASTObject.context
                                 ,&local_550,false);
                    }
                  }
                  local_b4 = 0;
                }
LAB_0044c929:
                ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
                ~ArrayWithPreallocation
                          ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                           &__range4_1);
              }
            }
LAB_0044c935:
            ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
            ~ArrayWithPreallocation
                      ((ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
                        *)&__range4);
            if (local_b4 == 0) goto LAB_0044c969;
          }
          else {
            (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
                 (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
            this_local = (FunctionResolver *)local_20;
            local_b4 = 1;
          }
        }
      }
    }
  }
  else {
LAB_0044c969:
    local_b4 = 0;
  }
LAB_0044c973:
  pool_ptr<soul::AST::QualifiedIdentifier>::~pool_ptr(&local_50);
  if (local_b4 != 0) {
    return (Expression *)this_local;
  }
LAB_0044c997:
  (this->super_ErrorIgnoringRewritingASTVisitor).numFails =
       (this->super_ErrorIgnoringRewritingASTVisitor).numFails + 1;
  return (Expression *)local_20;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            super::visit (call);

            if (AST::isResolvedAsType (call.nameOrType.get()))
                return convertToCast (allocator, call, call.nameOrType->resolveAsType());

            if (call.areAllArgumentsResolved())
            {
                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (name->getPath().isUnqualifiedName ("advance"))
                        return createAdvanceCall (call);

                    if (name->getPath().isUnqualifiedName ("static_assert"))
                        return ASTUtilities::createStaticAssertion (call.context, allocator, call.arguments->items);

                    if (name->getPath().isUnqualifiedName ("at"))
                        return createAtCall (call);

                    if (! name->isSimplePath())
                    {
                        numFails++;
                        return call;
                    }

                    if (call.arguments != nullptr)
                    {
                        for (auto& arg : call.arguments->items)
                        {
                            if (! AST::isResolvedAsValue (arg.get()))
                            {
                                if (ignoreErrors)
                                {
                                    ++numFails;
                                    return call;
                                }

                                SanityCheckPass::throwErrorIfNotReadableValue (arg);
                            }
                        }
                    }

                    auto possibles = findAllPossibleFunctions (call, *name);

                    for (auto& f : possibles)
                        if (f.functionIsNotResolved)
                            return call;

                    auto totalMatches = possibles.size();

                    // If there's only one function found, and we can call it (maybe with a cast), then go for it..
                    if (totalMatches == 1 && ! possibles.front().isImpossible)
                    {
                        if (auto resolved = resolveFunction (possibles.front(), call, ignoreErrors))
                            return *resolved;

                        return call;
                    }

                    auto exactMatches = countNumberOfExactMatches (possibles);

                    // If there's one exact match, then even if there are others requiring casts, we'll ignore them
                    // and go for the one which is a perfect match..
                    if (exactMatches == 1)
                    {
                        for (auto& f : possibles)
                        {
                            if (f.isExactMatch())
                            {
                                if (auto resolved = resolveFunction (f, call, ignoreErrors))
                                    return *resolved;

                                return call;
                            }
                        }

                        SOUL_ASSERT_FALSE;
                    }

                    // If there are any generic functions, see if exactly one of these works
                    ArrayWithPreallocation<pool_ref<AST::Expression>, 4> matchingGenerics;

                    for (auto& f : possibles)
                    {
                        if (! f.isImpossible && f.requiresGeneric)
                        {
                            if (auto e = resolveFunction (f, call, true))
                                matchingGenerics.push_back (*e);
                            else if (! canResolveGenerics())
                                return call;
                        }
                    }

                    if (matchingGenerics.size() == 1)
                        return matchingGenerics.front();

                    if (! ignoreErrors || matchingGenerics.size() > 1)
                    {
                        if (totalMatches == 0)
                            throwErrorForUnknownFunction (call, *name);

                        auto possibleWithCast = countNumberOfMatchesWithCast (possibles);

                        if (exactMatches + possibleWithCast == 0)
                        {
                            if (totalMatches == 1 && ! possibles.front().requiresGeneric)
                            {
                                auto paramTypes = possibles.front().function.getParameterTypes();
                                SOUL_ASSERT (paramTypes.size() == call.getNumArguments());

                                for (size_t i = 0; i < paramTypes.size(); ++i)
                                    if (! TypeRules::canPassAsArgumentTo (paramTypes[i], call.arguments->items[i]->getResultType(), true))
                                        SanityCheckPass::expectSilentCastPossible (call.arguments->items[i]->context,
                                                                                   paramTypes[i], call.arguments->items[i]);
                            }

                            if (totalMatches == 0 || matchingGenerics.size() <= 1)
                                call.context.throwError (Errors::noMatchForFunctionCall (call.getDescription (name->getPath().toString())));
                        }

                        if (totalMatches > 1 || matchingGenerics.size() > 1)
                        {
                            ArrayWithPreallocation<pool_ref<AST::Function>, 4> functions;

                            for (auto& f : possibles)
                                functions.push_back (f.function);

                            SanityCheckPass::checkForDuplicateFunctions (functions);

                            call.context.throwError (Errors::ambiguousFunctionCall (call.getDescription (name->getPath().toString())));
                        }
                    }
                }
            }

            ++numFails;
            return call;
        }